

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

ostream * Nova::Log::cout_Helper(void)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *this;
  
  if (cout_Helper()::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&cout_Helper()::helper);
    if (iVar1 != 0) {
      this = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x110);
      std::ostream::ostream
                (this,*(streambuf **)(std::__cxx11::stringbuf::str + *(long *)(std::cout + -0x18)));
      cout_Helper::helper.initialized = (bool *)&::(anonymous_namespace)::cout_initialized;
      ::(anonymous_namespace)::cout_initialized = 1;
      cout_Helper::helper.object = this;
      __cxa_atexit(anon_unknown.dwarf_61d42::
                   Initialization_Helper<std::basic_ostream<char,_std::char_traits<char>_>_>::
                   ~Initialization_Helper,&cout_Helper::helper,&__dso_handle);
      __cxa_guard_release(&cout_Helper()::helper);
    }
  }
  return cout_Helper::helper.object;
}

Assistant:

std::ostream& Nova::Log::cout_Helper()
{
    static Initialization_Helper<std::ostream> helper(new std::ostream(std::cout.rdbuf()),cout_initialized);
    return *helper.object;
}